

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O1

void Abc_NtkWriteFlopDependency(Abc_Ntk_t *pNtk,char *pFileName)

{
  char *pcVar1;
  long *plVar2;
  Abc_Obj_t *in_RAX;
  FILE *__stream;
  char *pcVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  Abc_Obj_t *pObj;
  Abc_Obj_t *local_38;
  
  local_38 = in_RAX;
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open input file %s.\n",pFileName);
    return;
  }
  pcVar1 = pNtk->pName;
  pcVar3 = Extra_TimeStamp();
  fprintf(__stream,"# Flop dependency for \"%s\" generated by ABC on %s\n",pcVar1,pcVar3);
  fwrite("digraph G {\n",0xc,1,__stream);
  fwrite("  graph [splines=true overlap=false];\n",0x26,1,__stream);
  fwrite("  size = \"7.5,10\";\n",0x13,1,__stream);
  fwrite("  center = true;\n",0x11,1,__stream);
  fwrite("  edge [dir=forward];\n",0x16,1,__stream);
  pVVar4 = pNtk->vBoxes;
  if (0 < pVVar4->nSize) {
    uVar6 = 0;
    do {
      plVar2 = (long *)pVVar4->pArray[uVar6];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
        local_38 = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
        plVar2 = (long *)local_38->pNtk->vObjs->pArray[*(local_38->vFanouts).pArray];
        *(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8) +
                0x40) = (int)uVar6;
        pVVar4 = Abc_NtkNodeSupport(pNtk,&local_38,1);
        if ((long)pVVar4->nSize < 1) {
          uVar7 = 0;
        }
        else {
          lVar5 = 0;
          uVar7 = 0;
          do {
            uVar7 = (ulong)((int)uVar7 +
                           (uint)((*(uint *)((long)pVVar4->pArray[lVar5] + 0x14) & 0xf) == 2));
            lVar5 = lVar5 + 1;
          } while (pVVar4->nSize != lVar5);
        }
        if (pVVar4->pArray != (void **)0x0) {
          free(pVVar4->pArray);
          pVVar4->pArray = (void **)0x0;
        }
        if (pVVar4 != (Vec_Ptr_t *)0x0) {
          free(pVVar4);
        }
        fprintf(__stream,"  { rank = same; %d [label=\"%d(%d)\"]; }\n",uVar6 & 0xffffffff,
                uVar6 & 0xffffffff,uVar7);
      }
      uVar6 = uVar6 + 1;
      pVVar4 = pNtk->vBoxes;
    } while ((long)uVar6 < (long)pVVar4->nSize);
  }
  pVVar4 = pNtk->vBoxes;
  if (0 < pVVar4->nSize) {
    uVar6 = 0;
    do {
      plVar2 = (long *)pVVar4->pArray[uVar6];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
        local_38 = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
        pVVar4 = Abc_NtkNodeSupport(pNtk,&local_38,1);
        if (0 < pVVar4->nSize) {
          lVar5 = 0;
          do {
            if ((*(uint *)((long)pVVar4->pArray[lVar5] + 0x14) & 0xf) != 2) {
              fprintf(__stream,"  %4d -> %4d\n",(ulong)*(uint *)((long)pVVar4->pArray[lVar5] + 0x40)
                      ,uVar6 & 0xffffffff);
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < pVVar4->nSize);
        }
        if (pVVar4->pArray != (void **)0x0) {
          free(pVVar4->pArray);
          pVVar4->pArray = (void **)0x0;
        }
        if (pVVar4 != (Vec_Ptr_t *)0x0) {
          free(pVVar4);
        }
      }
      uVar6 = uVar6 + 1;
      pVVar4 = pNtk->vBoxes;
    } while ((long)uVar6 < (long)pVVar4->nSize);
  }
  fwrite("}\n",2,1,__stream);
  fclose(__stream);
  return;
}

Assistant:

void Abc_NtkWriteFlopDependency( Abc_Ntk_t * pNtk, char * pFileName )
{
    FILE * pFile;
    Vec_Ptr_t * vSupp;
    Abc_Obj_t * pObj, * pTemp;
    int i, k, Count;
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        printf( "Cannot open input file %s.\n", pFileName );
        return;
    }
    fprintf( pFile, "# Flop dependency for \"%s\" generated by ABC on %s\n", Abc_NtkName(pNtk), Extra_TimeStamp() );
    fprintf( pFile, "digraph G {\n" );
    fprintf( pFile, "  graph [splines=true overlap=false];\n" );
    fprintf( pFile, "  size = \"7.5,10\";\n" );
    fprintf( pFile, "  center = true;\n" );
//    fprintf( pFile, "  edge [len=3,dir=forward];\n" );
    fprintf( pFile, "  edge [dir=forward];\n" );
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
    {
        Abc_ObjFanout0( Abc_ObjFanout0(pObj) )->iTemp = i;
        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        Count = 0;
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pTemp, k )
            Count += Abc_ObjIsPi(pTemp);
        Vec_PtrFree( vSupp );
        fprintf( pFile, "  { rank = same; %d [label=\"%d(%d)\"]; }\n", i, i, Count );
    }
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
    {
        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        Count = 0;
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pTemp, k )
            if ( !Abc_ObjIsPi(pTemp) )
                fprintf( pFile, "  %4d -> %4d\n", pTemp->iTemp, i );
        Vec_PtrFree( vSupp );
    }
    fprintf( pFile, "}\n" );
    fclose( pFile );
}